

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O1

pair<void_*,_embree::BBox<embree::Vec3fa>_> * __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<std::pair<void_*,_embree::BBox<embree::Vec3fa>_>,_embree::FastAllocator::CachedAllocator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:81:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:86:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:91:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:107:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:122:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:127:9)>
::createLargeLeaf(pair<void_*,_embree::BBox<embree::Vec3fa>_> *__return_storage_ptr__,
                 BuilderT<std::pair<void_*,_embree::BBox<embree::Vec3fa>_>,_embree::FastAllocator::CachedAllocator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:81:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:86:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:91:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:107:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:122:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:127:9)>
                 *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc)

{
  RTCBuildPrimitive *pRVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  anon_class_24_3_49846c50 *paVar5;
  anon_class_40_5_06182577 *paVar6;
  mvector<BVHBuilderMorton::BuildPrim> *pmVar7;
  PrimRef **ppPVar8;
  RTCBuildPrimitive **ppRVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  CachedAllocator alloc_00;
  float fVar12;
  float fVar13;
  uint uVar14;
  long lVar15;
  RTCBounds *pRVar16;
  void *pvVar17;
  undefined8 *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  range<unsigned_int> *current_00;
  uint uVar22;
  ulong uVar23;
  range<unsigned_int> rVar24;
  ulong uVar25;
  range<unsigned_int> rVar26;
  ulong uVar27;
  ulong uVar28;
  float *pfVar29;
  ulong uVar30;
  range<unsigned_int> children [8];
  void *childptrs [8];
  pair<void_*,_embree::BBox<embree::Vec3fa>_> bounds [8];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  range<unsigned_int> local_528;
  range<unsigned_int> local_520 [8];
  pair<void_*,_embree::BBox<embree::Vec3fa>_> local_4e0;
  RTCBounds *local_4a0 [8];
  RTCBuildPrimitive local_460;
  float local_440 [260];
  
  if ((this->super_Settings).maxDepth < depth) {
    puVar18 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_460._0_8_ = &local_460.upper_x;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"depth limit reached","");
    *puVar18 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar18 + 1) = 1;
    puVar18[2] = puVar18 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar18 + 2),local_460._0_8_,local_460._8_8_ + local_460._0_8_);
    __cxa_throw(puVar18,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar22 = current->_begin;
  uVar19 = (ulong)(current->_end - uVar22);
  uVar28 = (this->super_Settings).maxLeafSize;
  if (uVar28 < uVar19) {
    local_520[0] = *current;
    uVar19 = (this->super_Settings).branchingFactor;
    uVar30 = 1;
    do {
      if (uVar30 == 0) {
        uVar20 = 0xffffffffffffffff;
      }
      else {
        uVar27 = 0;
        uVar23 = 0;
        uVar21 = 0xffffffffffffffff;
        do {
          uVar25 = (ulong)(local_520[uVar27]._end - local_520[uVar27]._begin);
          uVar20 = uVar27;
          if (uVar25 <= uVar28 || uVar25 <= uVar23) {
            uVar20 = uVar21;
            uVar25 = uVar23;
          }
          uVar23 = uVar25;
          uVar27 = uVar27 + 1;
          uVar21 = uVar20;
        } while (uVar30 != uVar27);
      }
      if (uVar20 == 0xffffffffffffffff) break;
      uVar22 = local_520[uVar20]._end + local_520[uVar20]._begin >> 1;
      rVar26._end = local_520[uVar20]._end;
      rVar26._begin = uVar22;
      rVar24._end = uVar22;
      rVar24._begin = local_520[uVar20]._begin;
      local_520[uVar20] = (&local_528)[uVar30];
      (&local_528)[uVar30] = rVar24;
      local_520[uVar30] = rVar26;
      uVar30 = uVar30 + 1;
    } while (uVar30 < uVar19);
    uVar22 = (uint)uVar30;
    local_528 = (range<unsigned_int>)
                (**this->createNode->createNode)
                          ((RTCThreadLocalAllocator)&alloc,uVar22,*this->createNode->userPtr);
    lVar15 = 0;
    do {
      *(undefined8 *)((long)&local_460.lower_x + lVar15) = 0;
      lVar15 = lVar15 + 0x30;
    } while (lVar15 != 0x180);
    if (uVar30 != 0) {
      current_00 = local_520;
      pfVar29 = local_440;
      uVar28 = uVar30;
      do {
        alloc_00.talloc0 = alloc.talloc0;
        alloc_00.alloc = alloc.alloc;
        alloc_00.talloc1 = alloc.talloc1;
        createLargeLeaf(&local_4e0,this,depth + 1,current_00,alloc_00);
        *(void **)(pfVar29 + -8) = local_4e0.first;
        *(undefined8 *)(pfVar29 + -4) = local_4e0.second.lower.field_0._0_8_;
        *(undefined8 *)(pfVar29 + -2) = local_4e0.second.lower.field_0._8_8_;
        *(undefined8 *)pfVar29 = local_4e0.second.upper.field_0._0_8_;
        *(undefined8 *)(pfVar29 + 2) = local_4e0.second.upper.field_0._8_8_;
        pfVar29 = pfVar29 + 0xc;
        current_00 = current_00 + 1;
        uVar28 = uVar28 - 1;
      } while (uVar28 != 0);
    }
    rVar24 = local_528;
    paVar5 = this->setBounds;
    local_540 = _DAT_01feba00;
    local_550 = _DAT_01feb9f0;
    if (uVar30 != 0) {
      pRVar16 = (RTCBounds *)&local_460;
      uVar28 = 0;
      do {
        pRVar16 = (RTCBounds *)((long)pRVar16 + 0x10);
        auVar2._0_4_ = pRVar16->lower_x;
        auVar2._4_4_ = pRVar16->lower_y;
        auVar2._8_4_ = pRVar16->lower_z;
        auVar2._12_4_ = pRVar16->align0;
        local_550 = minps(local_550,auVar2);
        auVar3._0_4_ = pRVar16->upper_x;
        auVar3._4_4_ = pRVar16->upper_y;
        auVar3._8_4_ = pRVar16->upper_z;
        auVar3._12_4_ = pRVar16->align1;
        local_540 = maxps(local_540,auVar3);
        (&local_4e0.first)[uVar28] = *(void **)&pRVar16[-1].upper_x;
        local_4a0[uVar28] = pRVar16;
        uVar28 = uVar28 + 1;
        pRVar16 = pRVar16 + 1;
      } while (uVar30 != uVar28);
    }
    (**paVar5->setNodeBounds)((void *)local_528,local_4a0,uVar22,*paVar5->userPtr);
    (**paVar5->setNodeChildren)((void *)rVar24,&local_4e0.first,uVar22,*paVar5->userPtr);
    __return_storage_ptr__->first = (void *)rVar24;
  }
  else {
    paVar6 = this->createLeaf;
    local_540 = _DAT_01feba00;
    local_550 = _DAT_01feb9f0;
    if (current->_end != uVar22) {
      pmVar7 = paVar6->morton_src;
      ppPVar8 = paVar6->prims;
      ppRVar9 = paVar6->prims_i;
      lVar15 = 0;
      do {
        uVar4 = *(uint *)((long)&pmVar7->items[uVar22].field_0 + lVar15 + 4);
        local_550 = minps(local_550,(undefined1  [16])(*ppPVar8)[uVar4].lower.field_0);
        local_540 = maxps(local_540,(undefined1  [16])(*ppPVar8)[uVar4].upper.field_0);
        pRVar1 = *ppRVar9 + uVar4;
        uVar10 = *(undefined8 *)pRVar1;
        fVar13 = pRVar1->lower_z;
        uVar14 = pRVar1->geomID;
        pRVar1 = *ppRVar9 + uVar4;
        fVar12 = pRVar1->upper_y;
        uVar11 = *(undefined8 *)(&pRVar1->upper_x + 2);
        (local_440 + lVar15 + -4)[0] = pRVar1->upper_x;
        (local_440 + lVar15 + -4)[1] = fVar12;
        *(undefined8 *)(local_440 + lVar15 + -2) = uVar11;
        *(undefined8 *)(&local_460.lower_x + lVar15) = uVar10;
        (local_440 + lVar15 + -6)[0] = fVar13;
        (local_440 + lVar15 + -6)[1] = (float)uVar14;
        lVar15 = lVar15 + 8;
      } while ((uVar19 + (uVar19 == 0)) * 8 != lVar15);
    }
    pvVar17 = (**paVar6->createLeaf)
                        ((RTCThreadLocalAllocator)&alloc,&local_460,uVar19,*paVar6->userPtr);
    __return_storage_ptr__->first = pvVar17;
  }
  *(undefined8 *)&(__return_storage_ptr__->second).lower.field_0 = local_550._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->second).lower.field_0 + 8) = local_550._8_8_;
  *(undefined8 *)&(__return_storage_ptr__->second).upper.field_0 = local_540._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->second).upper.field_0 + 8) = local_540._8_8_;
  return __return_storage_ptr__;
}

Assistant:

ReductionTy createLargeLeaf(size_t depth, const range<unsigned>& current, Allocator alloc)
        {
          /* this should never occur but is a fatal error */
          if (depth > maxDepth)
            throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

          /* create leaf for few primitives */
          if (current.size() <= maxLeafSize)
            return createLeaf(current,alloc);

          /* fill all children by always splitting the largest one */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          size_t numChildren = 1;
          children[0] = current;

          do {

            /* find best child with largest number of primitives */
            size_t bestChild = -1;
            size_t bestSize = 0;
            for (size_t i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= maxLeafSize)
                continue;

              /* remember child with largest size */
              if (children[i].size() > bestSize) {
                bestSize = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == size_t(-1)) break;

            /*! split best child into left and right child */
            auto split = children[bestChild].split();

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = split.first;
            children[numChildren+0] = split.second;
            numChildren++;

          } while (numChildren < branchingFactor);

          /* create node */
          auto node = createNode(alloc,numChildren);

          /* recurse into each child */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          for (size_t i=0; i<numChildren; i++)
            bounds[i] = createLargeLeaf(depth+1,children[i],alloc);

          return setBounds(node,bounds,numChildren);
        }